

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::hyperChooseColumnBasicFeasibilityChange(HEkkPrimal *this)

{
  HEkk *pHVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  HighsInt to_entry;
  int local_2c;
  
  if (this->use_hyper_chuzc == true) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2b,0);
    pHVar1 = this->ekk_instance_;
    bVar2 = HSimplexNla::sparseLoopStyle
                      (&pHVar1->simplex_nla_,(this->row_basic_feasibility_change).count,
                       this->num_col,&local_2c);
    lVar5 = (long)local_2c;
    if (0 < lVar5) {
      lVar4 = 0;
      do {
        if (bVar2) {
          iVar3 = (this->row_basic_feasibility_change).index.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar4];
        }
        else {
          iVar3 = (int)lVar4;
        }
        dVar6 = (double)-(int)(pHVar1->basis_).nonbasicMove_.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar3] *
                (pHVar1->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar3];
        if (this->dual_feasibility_tolerance <= dVar6 && dVar6 != this->dual_feasibility_tolerance)
        {
          hyperChooseColumnChangedInfeasibility(this,dVar6,iVar3);
        }
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
    bVar2 = HSimplexNla::sparseLoopStyle
                      (&this->ekk_instance_->simplex_nla_,(this->col_basic_feasibility_change).count
                       ,this->num_row,&local_2c);
    if (0 < (long)local_2c) {
      lVar5 = 0;
      do {
        if (bVar2) {
          iVar3 = (this->col_basic_feasibility_change).index.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar5];
        }
        else {
          iVar3 = (int)lVar5;
        }
        lVar4 = (long)iVar3 + (long)this->num_col;
        dVar6 = (double)-(int)(pHVar1->basis_).nonbasicMove_.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar4] *
                (pHVar1->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar4];
        if (this->dual_feasibility_tolerance <= dVar6 && dVar6 != this->dual_feasibility_tolerance)
        {
          hyperChooseColumnChangedInfeasibility(this,dVar6,(HighsInt)lVar4);
        }
        lVar5 = lVar5 + 1;
      } while (local_2c != lVar5);
    }
    if (((this->row_out < 0) && ((this->nonbasic_free_col_set).count_ != 0)) &&
       (0 < (this->nonbasic_free_col_set).count_)) {
      lVar5 = 0;
      do {
        iVar3 = (this->nonbasic_free_col_set).entry_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar5];
        dVar6 = ABS((pHVar1->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar3]);
        if (this->dual_feasibility_tolerance <= dVar6 && dVar6 != this->dual_feasibility_tolerance)
        {
          hyperChooseColumnChangedInfeasibility(this,dVar6,iVar3);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (this->nonbasic_free_col_set).count_);
    }
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2b,0);
  }
  return;
}

Assistant:

void HEkkPrimal::hyperChooseColumnBasicFeasibilityChange() {
  if (!use_hyper_chuzc) return;
  analysis->simplexTimerStart(ChuzcHyperBasicFeasibilityChangeClock);
  const vector<double>& workDual = ekk_instance_.info_.workDual_;
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  HighsInt to_entry;
  const bool use_row_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      row_basic_feasibility_change.count, num_col, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iCol =
        use_row_indices ? row_basic_feasibility_change.index[iEntry] : iEntry;
    double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
    if (dual_infeasibility > dual_feasibility_tolerance)
      hyperChooseColumnChangedInfeasibility(dual_infeasibility, iCol);
  }
  const bool use_col_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      col_basic_feasibility_change.count, num_row, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow =
        use_col_indices ? col_basic_feasibility_change.index[iEntry] : iEntry;
    HighsInt iCol = num_col + iRow;
    double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
    if (dual_infeasibility > dual_feasibility_tolerance)
      hyperChooseColumnChangedInfeasibility(dual_infeasibility, iCol);
  }
  // Any nonbasic free columns will be handled explicitly in
  // hyperChooseColumnDualChange, so only look at them here if not
  // flipping
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  if (row_out < 0 && num_nonbasic_free_col) {
    const vector<HighsInt>& nonbasic_free_col_set_entry =
        nonbasic_free_col_set.entry();
    for (HighsInt iEntry = 0; iEntry < num_nonbasic_free_col; iEntry++) {
      HighsInt iCol = nonbasic_free_col_set_entry[iEntry];
      double dual_infeasibility = fabs(workDual[iCol]);
      if (dual_infeasibility > dual_feasibility_tolerance)
        hyperChooseColumnChangedInfeasibility(dual_infeasibility, iCol);
    }
  }
  analysis->simplexTimerStop(ChuzcHyperBasicFeasibilityChangeClock);
}